

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shifts.c
# Opt level: O1

uint32_t arm_ror(status_register_t *cpsr,uint32_t data,uint32_t shift_amount)

{
  byte bVar1;
  
  if ((shift_amount != 0) &&
     (bVar1 = (byte)shift_amount & 0x1f, data = data >> bVar1 | data << 0x20 - bVar1,
     cpsr != (status_register_t *)0x0)) {
    cpsr->raw = cpsr->raw & 0xdfffffff | data >> 2 & 0x20000000;
  }
  return data;
}

Assistant:

word arm_ror(status_register_t* cpsr, word data, word shift_amount) {
    if (shift_amount == 0) {
        return data;
    }

    shift_amount &= 31u;
    word result = (data >> shift_amount) | (data << (-shift_amount & 31u));
    if (cpsr) cpsr->C = result >> 31u;
    return result;
}